

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

ssize_t peek_at_header(archive_read_filter *filter,int *pbits,private_data_conflict1 *state)

{
  byte bVar1;
  byte bVar2;
  int64_t *piVar3;
  int iVar4;
  uint32_t uVar5;
  archive_read_filter *min;
  char *pcVar6;
  archive_read_filter *paVar7;
  void *pvVar8;
  ssize_t file_start;
  int header_flags;
  int bits;
  ssize_t len;
  ssize_t avail;
  uchar *p;
  private_data_conflict1 *state_local;
  int *pbits_local;
  archive_read_filter *filter_local;
  
  _header_flags = (archive_read_filter *)0xa;
  p = (uchar *)state;
  state_local = (private_data_conflict1 *)pbits;
  pbits_local = (int *)filter;
  avail = (ssize_t)__archive_read_filter_ahead(filter,10,&len);
  if (((void *)avail == (void *)0x0) || (len == 0)) {
    filter_local = (archive_read_filter *)0x0;
  }
  else {
    iVar4 = memcmp((void *)avail,anon_var_dwarf_15889b8,3);
    if (iVar4 == 0) {
      if ((*(byte *)(avail + 3) & 0xe0) == 0) {
        bVar1 = *(byte *)(avail + 3);
        if (p != (uchar *)0x0) {
          uVar5 = archive_le32dec((void *)(avail + 4));
          *(uint32_t *)(p + 0x98) = uVar5;
        }
        if ((bVar1 & 4) != 0) {
          avail = (ssize_t)__archive_read_filter_ahead((archive_read_filter *)pbits_local,0xc,&len);
          if ((void *)avail == (void *)0x0) {
            return 0;
          }
          _header_flags = (archive_read_filter *)((long)(int)(uint)*(ushort *)(avail + 10) + 0xc);
        }
        paVar7 = _header_flags;
        if ((bVar1 & 8) != 0) {
          do {
            min = (archive_read_filter *)((long)&_header_flags->position + 1);
            if (len < (long)min) {
              avail = (ssize_t)__archive_read_filter_ahead
                                         ((archive_read_filter *)pbits_local,(size_t)min,&len);
            }
            if (avail == 0) {
              return 0;
            }
            piVar3 = &_header_flags->position;
            _header_flags = min;
          } while (*(char *)((long)piVar3 + avail) != '\0');
          if (p != (uchar *)0x0) {
            free(*(void **)(p + 0xa0));
            pcVar6 = strdup((char *)((long)&paVar7->position + avail));
            *(char **)(p + 0xa0) = pcVar6;
          }
        }
        bVar2 = bVar1 & 0x10;
        while (bVar2 != 0) {
          paVar7 = (archive_read_filter *)((long)&_header_flags->position + 1);
          if (len < (long)paVar7) {
            avail = (ssize_t)__archive_read_filter_ahead
                                       ((archive_read_filter *)pbits_local,(size_t)paVar7,&len);
          }
          if (avail == 0) {
            return 0;
          }
          bVar2 = *(byte *)((long)&_header_flags->position + avail);
          _header_flags = paVar7;
        }
        if ((bVar1 & 2) != 0) {
          pvVar8 = __archive_read_filter_ahead
                             ((archive_read_filter *)pbits_local,
                              (size_t)((long)&_header_flags->position + 2),&len);
          if (pvVar8 == (void *)0x0) {
            return 0;
          }
          _header_flags = (archive_read_filter *)((long)&_header_flags->position + 2);
        }
        if (state_local != (private_data_conflict1 *)0x0) {
          *(undefined4 *)&(state_local->stream).next_in = 0x1b;
        }
        filter_local = _header_flags;
      }
      else {
        filter_local = (archive_read_filter *)0x0;
      }
    }
    else {
      filter_local = (archive_read_filter *)0x0;
    }
  }
  return (ssize_t)filter_local;
}

Assistant:

static ssize_t
peek_at_header(struct archive_read_filter *filter, int *pbits,
#ifdef HAVE_ZLIB_H
	       struct private_data *state
#else
	       void *state
#endif
	      )
{
	const unsigned char *p;
	ssize_t avail, len;
	int bits = 0;
	int header_flags;
#ifndef HAVE_ZLIB_H
	(void)state; /* UNUSED */
#endif

	/* Start by looking at the first ten bytes of the header, which
	 * is all fixed layout. */
	len = 10;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);
	/* We only support deflation- third byte must be 0x08. */
	if (memcmp(p, "\x1F\x8B\x08", 3) != 0)
		return (0);
	bits += 24;
	if ((p[3] & 0xE0)!= 0)	/* No reserved flags set. */
		return (0);
	bits += 3;
	header_flags = p[3];
	/* Bytes 4-7 are mod time in little endian. */
#ifdef HAVE_ZLIB_H
	if (state)
		state->mtime = archive_le32dec(p + 4);
#endif
	/* Byte 8 is deflate flags. */
	/* XXXX TODO: return deflate flags back to consume_header for use
	   in initializing the decompressor. */
	/* Byte 9 is OS. */

	/* Optional extra data:  2 byte length plus variable body. */
	if (header_flags & 4) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
		len += ((int)p[len + 1] << 8) | (int)p[len];
		len += 2;
	}

	/* Null-terminated optional filename. */
	if (header_flags & 8) {
#ifdef HAVE_ZLIB_H
		ssize_t file_start = len;
#endif
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);

#ifdef HAVE_ZLIB_H
		if (state) {
			/* Reset the name in case of repeat header reads. */
			free(state->name);
			state->name = strdup((const char *)&p[file_start]);
		}
#endif
	}

	/* Null-terminated optional comment. */
	if (header_flags & 16) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Optional header CRC */
	if ((header_flags & 2)) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
#if 0
	int hcrc = ((int)p[len + 1] << 8) | (int)p[len];
	int crc = /* XXX TODO: Compute header CRC. */;
	if (crc != hcrc)
		return (0);
	bits += 16;
#endif
		len += 2;
	}

	if (pbits != NULL)
		*pbits = bits;
	return (len);
}